

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-export.cc
# Opt level: O2

bool tinyusdz::tydra::export_to_obj
               (RenderScene *scene,int mesh_id,string *obj_str,string *mtl_str,string *warn,
               string *err)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  VertexVariability VVar1;
  undefined4 uVar2;
  pointer pRVar3;
  pointer puVar4;
  _Base_ptr p_Var5;
  pointer pRVar6;
  pointer pUVar7;
  pointer pTVar8;
  uint uVar9;
  ostream *poVar10;
  size_type sVar11;
  mapped_type *this_00;
  size_t sVar12;
  _Base_ptr *pp_Var13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  pointer puVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar17;
  size_type sVar18;
  pointer paVar19;
  undefined7 uVar21;
  __node_base _Var20;
  size_t i_2;
  _Rb_tree_node_base *p_Var22;
  float *pfVar23;
  undefined8 uVar24;
  undefined1 uVar25;
  size_t i;
  RenderMesh *__lhs;
  ulong uVar26;
  undefined8 uVar27;
  int iVar28;
  pointer paVar29;
  char *pcVar30;
  unsigned_long *puVar31;
  unsigned_long *args_1;
  size_t f;
  long lVar32;
  ulong uVar33;
  size_t i_1;
  unsigned_long uVar34;
  bool bVar35;
  allocator local_459;
  int64_t imageId;
  float local_450;
  int32_t texId;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined1 local_430;
  float local_42c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  subset_face_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids;
  byte local_3a4;
  int mesh_id_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  ostringstream ss_e;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_370 [15];
  string *local_200;
  string *local_1f8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  face_groups;
  stringstream ss;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  mesh_id_local = mesh_id;
  local_1f8 = obj_str;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (mesh_id < 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar10 = ::std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               );
    poVar10 = ::std::operator<<(poVar10,":");
    poVar10 = ::std::operator<<(poVar10,"export_to_obj");
    poVar10 = ::std::operator<<(poVar10,"():");
    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x26);
    ::std::operator<<(poVar10," ");
    pcVar30 = "Invalid mesh_id";
LAB_00273a58:
    poVar10 = ::std::operator<<((ostream *)&ss_e,pcVar30);
    ::std::operator<<(poVar10,"\n");
  }
  else {
    pRVar3 = (scene->meshes).
             super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(uint)mesh_id <
        (ulong)(((long)(scene->meshes).
                       super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) / 0x520)) {
      __lhs = pRVar3 + (uint)mesh_id;
      local_448._M_allocated_capacity = (size_type)err;
      local_200 = mtl_str;
      ::std::operator<<(local_1a8,"# exported from TinyUSDZ Tydra.\n");
      poVar10 = ::std::operator<<(local_1a8,"mtllib ");
      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,mesh_id);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss_e,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       ".mtl");
      ::std::operator<<(poVar10,(string *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,"\n");
      lVar32 = 0;
      for (uVar26 = 0;
          uVar26 < (ulong)(((long)(__lhs->points).
                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(__lhs->points).
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc);
          uVar26 = uVar26 + 1) {
        poVar10 = ::std::operator<<(local_1a8,"v ");
        poVar10 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar10,*(float *)((long)((__lhs->points).
                                                                                                              
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar32));
        poVar10 = ::std::operator<<(poVar10," ");
        poVar10 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar10,*(float *)((long)((__lhs->points).
                                                                                                              
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar32 + 4));
        poVar10 = ::std::operator<<(poVar10," ");
        poVar10 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar10,*(float *)((long)((__lhs->points).
                                                                                                              
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar32 + 8));
        ::std::operator<<(poVar10,"\n");
        lVar32 = lVar32 + 0xc;
      }
      poVar10 = ::std::operator<<(local_1a8,"# ");
      poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      ::std::operator<<(poVar10," vertices\n");
      paVar29 = (__lhs->points).
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar19 = (__lhs->points).
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar31 = (unsigned_long *)(long)(__lhs->joint_and_weights).elementSize;
      args_1 = puVar31;
      local_448._8_8_ = __lhs;
      if ((long)(__lhs->joint_and_weights).jointWeights.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(__lhs->joint_and_weights).jointWeights.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start >> 2 == (((long)paVar19 - (long)paVar29) / 0xc) * (long)puVar31) {
        p_Var22 = (_Rb_tree_node_base *)0x0;
        uVar26 = 0;
        while( true ) {
          lVar32 = (long)paVar19 - (long)paVar29;
          paVar19 = (pointer)0x0;
          if ((ulong)(lVar32 / 0xc) <= uVar26) break;
          ::std::operator<<(local_1a8,"vw ");
          lVar32 = 0;
          _local_438 = p_Var22;
          while ((unsigned_long *)-lVar32 != puVar31) {
            bVar35 = lVar32 != 0;
            lVar32 = lVar32 + -1;
            if (bVar35) {
              ::std::operator<<(local_1a8," ");
            }
            poVar10 = (ostream *)
                      ::std::ostream::operator<<
                                (local_1a8,
                                 *(int *)((long)&((_Rb_tree_node_base *)&p_Var22->_M_color)->
                                                 _M_color +
                                         (long)(__lhs->joint_and_weights).jointIndices.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start));
            poVar10 = ::std::operator<<(poVar10," ");
            ::std::ostream::operator<<
                      (poVar10,*(float *)((long)&((_Rb_tree_node_base *)&p_Var22->_M_color)->
                                                 _M_color +
                                         (long)(__lhs->joint_and_weights).jointWeights.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start));
            p_Var22 = (_Rb_tree_node_base *)&p_Var22->field_0x4;
          }
          ::std::operator<<(local_1a8,"\n");
          uVar26 = uVar26 + 1;
          paVar29 = (((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     (local_448._8_8_ + 0x68))->
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          paVar19 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_448._8_8_ + 0x70))->_M_allocated_capacity;
          p_Var22 = (_Rb_tree_node_base *)(_local_438 + (long)puVar31 * 4);
        }
      }
      uVar27 = local_448._8_8_;
      this = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(local_448._8_8_ + 0x180);
      _ss_e = 0;
      sVar11 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(this,(key_type_conflict1 *)&ss_e);
      uVar21 = (undefined7)((ulong)paVar19 >> 8);
      local_3a4 = 1;
      if (sVar11 == 0) {
        _local_430 = 1.4013e-45;
LAB_00271704:
        err = (string *)local_448._M_allocated_capacity;
        puVar4 = (((RenderMesh *)uVar27)->normals).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar4 == (((RenderMesh *)uVar27)->normals).data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          local_450 = 0.0;
        }
        else {
          VVar1 = (((RenderMesh *)uVar27)->normals).variability;
          local_3a4 = 1;
          local_450 = (float)CONCAT71(uVar21,1);
          if (VVar1 != FaceVarying) {
            if (VVar1 != Vertex) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"export_to_obj");
              poVar10 = ::std::operator<<(poVar10,"():");
              iVar28 = 100;
              goto LAB_00273a39;
            }
            local_450 = 0.0;
          }
          if ((((RenderMesh *)uVar27)->normals).format == Vec3) {
            pfVar23 = (float *)(puVar4 + 8);
            for (uVar26 = 0;
                sVar12 = VertexAttribute::vertex_count(&((RenderMesh *)uVar27)->normals),
                uVar26 < sVar12; uVar26 = uVar26 + 1) {
              poVar10 = ::std::operator<<(local_1a8,"vn ");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,pfVar23[-2]);
              poVar10 = ::std::operator<<(poVar10," ");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,pfVar23[-1]);
              poVar10 = ::std::operator<<(poVar10," ");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,*pfVar23);
              ::std::operator<<(poVar10,"\n");
              pfVar23 = pfVar23 + 3;
            }
            local_3a4 = 0;
            uVar27 = local_448._8_8_;
          }
        }
        face_groups._M_h._M_buckets = &face_groups._M_h._M_single_bucket;
        face_groups._M_h._M_bucket_count = 1;
        face_groups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        face_groups._M_h._M_element_count = 0;
        face_groups._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        face_groups._M_h._M_rehash_policy._M_next_resize = 0;
        face_groups._M_h._M_single_bucket = (__node_base_ptr)0x0;
        if ((((RenderMesh *)uVar27)->material_subsetMap)._M_t._M_impl.super__Rb_tree_header.
            _M_node_count == 0) {
          pvVar17 = RenderMesh::faceVertexCounts((RenderMesh *)uVar27);
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&face_ids_2,
                     (long)(pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&ss_e);
          uVar9 = 0;
          for (puVar16 = face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              puVar16 !=
              face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish; puVar16 = puVar16 + 1) {
            *puVar16 = uVar9;
            uVar9 = uVar9 + 1;
          }
          ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
          pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
                    ((pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&ss_e,
                     &((RenderMesh *)uVar27)->material_id,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          ::std::__cxx11::string::string((string *)&subset_face_ids,"",(allocator *)&face_ids);
          pmVar14 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&face_groups,(key_type *)&subset_face_ids);
          ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
                    (pmVar14,(pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                             )&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_370)
          ;
          ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
        else {
          subset_face_ids._M_h._M_buckets = &subset_face_ids._M_h._M_single_bucket;
          subset_face_ids._M_h._M_bucket_count = 1;
          subset_face_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          subset_face_ids._M_h._M_element_count = 0;
          subset_face_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          subset_face_ids._M_h._M_rehash_policy._M_next_resize = 0;
          subset_face_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
          _local_438 = &(((RenderMesh *)uVar27)->material_subsetMap)._M_t._M_impl.
                        super__Rb_tree_header;
          for (p_Var15 = (((RenderMesh *)uVar27)->material_subsetMap)._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left; p_Var15 != (_Base_ptr)_local_438;
              p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15)) {
            pp_Var13 = &p_Var15[6]._M_parent;
            if (p_Var15[6]._M_left == p_Var15[6]._M_parent) {
              pp_Var13 = &p_Var15[5]._M_left;
            }
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&offsets,
                       (long)pp_Var13[1] - (long)*pp_Var13 >> 2,(allocator_type *)&ss_e);
            lVar32 = 0;
            uVar26 = 0;
            while( true ) {
              pp_Var13 = &p_Var15[6]._M_parent;
              if (p_Var15[6]._M_left == p_Var15[6]._M_parent) {
                pp_Var13 = &p_Var15[5]._M_left;
              }
              if ((ulong)((long)pp_Var13[1] - (long)*pp_Var13 >> 2) <= uVar26) break;
              *(undefined4 *)
               ((long)offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar32) =
                   *(undefined4 *)((long)&(*pp_Var13)->_M_color + lVar32);
              ::std::__detail::
              _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)&subset_face_ids,
                       (value_type *)
                       ((long)offsets.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar32));
              uVar26 = uVar26 + 1;
              lVar32 = lVar32 + 4;
            }
            p_Var5 = p_Var15[1]._M_parent;
            if (p_Var5 == (_Base_ptr)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"export_to_obj");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x7c);
              ::std::operator<<(poVar10," ");
              poVar10 = ::std::operator<<((ostream *)&ss_e,
                                          "Empty material_subset name is not allowed.");
              ::std::operator<<(poVar10,"\n");
              uVar27 = local_448._M_allocated_capacity;
              if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&face_ids_2,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&face_ids,"\n");
                ::std::__cxx11::string::append((string *)uVar27);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
            else {
              ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
                        ((pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                         &ss_e,(int *)&p_Var15[5]._M_parent,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&offsets);
              pmVar14 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&face_groups,(key_type *)(p_Var15 + 1));
              ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
                        (pmVar14,(pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&ss_e);
              ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (local_370);
            }
            ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&offsets);
            if (p_Var5 == (_Base_ptr)0x0) {
              ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable(&subset_face_ids._M_h);
              uVar25 = 0;
              goto LAB_002746ef;
            }
          }
          face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          for (uVar26 = 0; pvVar17 = RenderMesh::faceVertexCounts((RenderMesh *)local_448._8_8_),
              uVar27 = local_448._8_8_,
              uVar26 < (ulong)((long)(pvVar17->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar17->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 2);
              uVar26 = uVar26 + 1) {
            _ss_e = (int)uVar26;
            sVar18 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(&subset_face_ids._M_h,(key_type_conflict1 *)&ss_e);
            if (sVar18 == 0) {
              _ss_e = (int)uVar26;
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (&face_ids,(uint *)&ss_e);
            }
          }
          ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
          pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_true>
                    ((pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&ss_e,
                     (int *)(local_448._8_8_ + 0x4e0),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          ::std::__cxx11::string::string((string *)&face_ids_2,"",(allocator *)&offsets);
          pmVar14 = ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&face_groups,(key_type *)&face_ids_2);
          ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
                    (pmVar14,(pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *
                             )&ss_e);
          ::std::__cxx11::string::_M_dispose();
          ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(local_370)
          ;
          ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&subset_face_ids._M_h);
        }
        pvVar17 = RenderMesh::faceVertexCounts((RenderMesh *)uVar27);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&offsets,(long)(pvVar17->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar17->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 2,
                   (allocator_type *)&ss_e);
        uVar34 = 0;
        for (uVar26 = 0; pvVar17 = RenderMesh::faceVertexCounts((RenderMesh *)uVar27),
            uVar26 < (ulong)((long)(pvVar17->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar17->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 2);
            uVar26 = uVar26 + 1) {
          offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = uVar34;
          pvVar17 = RenderMesh::faceVertexCounts((RenderMesh *)uVar27);
          uVar34 = uVar34 + (pvVar17->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar26];
        }
        local_42c = (float)CONCAT31(local_42c._1_3_,(byte)_local_430 | local_3a4);
        _local_438 = (_Rb_tree_node_base *)0x0;
        for (_Var20 = face_groups._M_h._M_before_begin; _Var20._M_nxt != (_Hash_node_base *)0x0;
            _Var20._M_nxt = (_Var20._M_nxt)->_M_nxt) {
          if (_Var20._M_nxt[2]._M_nxt != (_Hash_node_base *)0x0) {
            poVar10 = ::std::operator<<(local_1a8,"g ");
            poVar10 = ::std::operator<<(poVar10,(string *)(_Var20._M_nxt + 1));
            ::std::operator<<(poVar10,"\n");
          }
          iVar28 = *(int *)&_Var20._M_nxt[5]._M_nxt;
          if (-1 < (long)iVar28) {
            poVar10 = ::std::operator<<(local_1a8,"usemtl ");
            poVar10 = ::std::operator<<(poVar10,(string *)
                                                ((scene->materials).
                                                 super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + iVar28)
                                       );
            ::std::operator<<(poVar10,"\n");
          }
          for (uVar26 = 0;
              uVar26 < (ulong)((long)_Var20._M_nxt[7]._M_nxt - (long)_Var20._M_nxt[6]._M_nxt >> 2);
              uVar26 = uVar26 + 1) {
            ::std::operator<<(local_1a8,"f ");
            for (uVar33 = 0; pvVar17 = RenderMesh::faceVertexCounts((RenderMesh *)uVar27),
                uVar33 < (pvVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start
                         [*(uint *)((long)&(_Var20._M_nxt[6]._M_nxt)->_M_nxt + uVar26 * 4)];
                uVar33 = uVar33 + 1) {
              if (uVar33 != 0) {
                ::std::operator<<(local_1a8," ");
              }
              RenderMesh::faceVertexIndices((RenderMesh *)uVar27);
              poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              uVar27 = local_448._8_8_;
              if (local_42c._0_1_ == '\0') {
                poVar10 = ::std::operator<<(poVar10,"/");
                poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                poVar10 = ::std::operator<<(poVar10,"/");
                uVar27 = local_448._8_8_;
LAB_00271e7c:
                ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              }
              else {
                if (local_430 == '\0') {
                  poVar10 = ::std::operator<<(poVar10,"/");
                  uVar27 = local_448._8_8_;
                  goto LAB_00271e7c;
                }
                if (local_3a4 == 0) {
                  poVar10 = ::std::operator<<(poVar10,"//");
                  goto LAB_00271e7c;
                }
              }
            }
            pvVar17 = RenderMesh::faceVertexIndices((RenderMesh *)uVar27);
            _local_438 = _local_438 +
                         (ulong)(pvVar17->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [*(uint *)((long)&(_Var20._M_nxt[6]._M_nxt)->_M_nxt + uVar26 * 4)];
            ::std::operator<<(local_1a8,"\n");
          }
          ::std::operator<<(local_1a8,"\n");
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)local_1f8,(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::string((string *)&ss_e,"",(allocator *)&subset_face_ids);
        ::std::__cxx11::stringbuf::str(local_1a0);
        ::std::__cxx11::string::_M_dispose();
        ::std::operator<<(local_1a8,"# exported from TinyUSDZ Tydra.\n");
        _Var20 = face_groups._M_h._M_before_begin;
        while( true ) {
          uVar27 = CONCAT71((int7)((ulong)uVar27 >> 8),_Var20._M_nxt == (_Hash_node_base *)0x0);
          if (_Var20._M_nxt == (_Hash_node_base *)0x0) break;
          uVar9 = *(uint *)&_Var20._M_nxt[5]._M_nxt;
          if ((ulong)uVar9 != 0xffffffff) {
            local_448._8_4_ = (int)uVar27;
            poVar10 = ::std::operator<<(local_1a8,"newmtl ");
            uVar24 = (ulong)uVar9 * 0x100;
            poVar10 = ::std::operator<<(poVar10,(string *)
                                                ((long)&((_Rb_tree_node_base *)
                                                        &((_Rb_tree_node_base *)uVar24)->_M_color)->
                                                        _M_color +
                                                (long)(scene->materials).
                                                                                                            
                                                  super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
            ::std::operator<<(poVar10,"\n");
            pRVar6 = (scene->materials).
                     super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_left + (long)pRVar6
                             );
            _local_438 = uVar24;
            if ((long)iVar28 < 0) {
              _local_430 = *(undefined4 *)
                            (&((_Rb_tree_node_base *)(uVar24 + 0x60))->field_0x4 + (long)pRVar6);
              local_42c = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_parent +
                                    (long)pRVar6);
              local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_parent +
                                    (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
              poVar10 = ::std::operator<<(local_1a8,"Kd ");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,(float)_local_430);
              poVar10 = ::std::operator<<(poVar10," ");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_42c);
              poVar10 = ::std::operator<<(poVar10," ");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
              ::std::operator<<(poVar10,"\n");
              uVar27 = local_448._8_8_ & 0xffffffff;
LAB_0027228a:
              poVar10 = local_1a8;
              pRVar6 = (scene->materials).
                       super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(char *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_color + (long)pRVar6)
                  == '\x01') {
                iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_left +
                                 (long)pRVar6);
                if ((long)iVar28 < 0) {
                  _local_430 = *(undefined4 *)
                                (&((_Rb_tree_node_base *)(uVar24 + 0x80))->field_0x4 + (long)pRVar6)
                  ;
                  local_42c = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_parent +
                                        (long)pRVar6);
                  local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_parent +
                                        (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                  poVar10 = ::std::operator<<(poVar10,"Ks ");
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,(float)_local_430);
                  poVar10 = ::std::operator<<(poVar10," ");
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_42c);
                  pcVar30 = " ";
                  uVar24 = _local_438;
LAB_00272498:
                  poVar10 = ::std::operator<<(poVar10,pcVar30);
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                  ::std::operator<<(poVar10,"\n");
LAB_00272673:
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_color +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_right
                                          + (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    poVar10 = ::std::operator<<(local_1a8,"Pr ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x11c;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x121;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x126);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Pr ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_color +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    _local_430 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_left
                                           + (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    local_42c = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_right
                                          + (long)pRVar6);
                    local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x60))->_M_right
                                          + (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    poVar10 = ::std::operator<<(local_1a8,"Ke ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,(float)_local_430);
                    poVar10 = ::std::operator<<(poVar10," ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_42c);
                    uVar24 = _local_438;
                    poVar10 = ::std::operator<<(poVar10," ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x131;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x136;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x13b);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Ke ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_right +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_left +
                                          (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    poVar10 = ::std::operator<<(local_1a8,"d ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x147;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x14c;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x151);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_d ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_parent +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_450 = *(float *)(&((_Rb_tree_node_base *)(uVar24 + 0xa0))->field_0x4 +
                                          (long)pRVar6);
                    poVar10 = ::std::operator<<(local_1a8,"Pc ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x15d;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x162;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x167);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Pc ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_left +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_parent
                                          + (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    poVar10 = ::std::operator<<(local_1a8,"Pcr ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x172;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x177;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x17c);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Pcr ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xc0))->_M_parent +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_parent
                                          + (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    poVar10 = ::std::operator<<(local_1a8,"Ni ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,local_450);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x187;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x18c;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x191);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Ni ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xe0))->_M_parent +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_438 = *(undefined4 *)
                                 (&((_Rb_tree_node_base *)(uVar24 + 0xe0))->field_0x4 + (long)pRVar6
                                 );
                    poVar10 = ::std::operator<<(local_1a8,"Ka ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,(float)local_438);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x19d;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x1a2;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1a7);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                      uVar24 = _local_438;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Ka ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  pRVar6 = (scene->materials).
                           super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0xc0))->_M_parent +
                                   (long)pRVar6);
                  if ((long)iVar28 < 0) {
                    local_448._8_4_ =
                         *(undefined4 *)
                          ((long)&((_Rb_tree_node_base *)(uVar24 + 0xa0))->_M_parent +
                          (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                    poVar10 = ::std::operator<<(local_1a8,"Ni ");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,(float)local_448._8_4_);
                    ::std::operator<<(poVar10,"\n");
                  }
                  else {
                    pUVar7 = (scene->textures).
                             super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    texId = iVar28;
                    if ((int)(((long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                             0x158) <= iVar28) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x1b3;
                      goto LAB_002745f3;
                    }
                    imageId = pUVar7[iVar28].texture_image_id;
                    if ((imageId < 0) ||
                       (pTVar8 = (scene->images).
                                 super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       ((long)(scene->images).
                              super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                       imageId)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      iVar28 = 0x1b8;
                      goto LAB_00274181;
                    }
                    ::std::__cxx11::string::string
                              ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                    sVar18 = subset_face_ids._M_h._M_bucket_count;
                    if (subset_face_ids._M_h._M_bucket_count == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x1bd);
                      ::std::operator<<(poVar10," ");
                      ::std::__cxx11::string::string
                                ((string *)&face_ids,"Filename for image id {} is empty.",&local_459
                                );
                      fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                      ::std::operator<<(poVar10,"\n");
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                      uVar27 = local_448._M_allocated_capacity;
                      if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                        ::std::__cxx11::string::append((string *)uVar27);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      uVar27 = local_448._8_8_ & 0xffffffff;
                    }
                    else {
                      poVar10 = ::std::operator<<(local_1a8,"map_Ni ");
                      poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                      ::std::operator<<(poVar10,"\n");
                    }
                    ::std::__cxx11::string::_M_dispose();
                    if (sVar18 == 0) goto LAB_002746e2;
                  }
                  ::std::operator<<(local_1a8,"\n");
                  goto LAB_002739c3;
                }
                pUVar7 = (scene->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                texId = iVar28;
                if (iVar28 < (int)(((long)(scene->textures).
                                          super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7)
                                  / 0x158)) {
                  imageId = pUVar7[iVar28].texture_image_id;
                  if ((imageId < 0) ||
                     (pTVar8 = (scene->images).
                               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                     ((long)(scene->images).
                            super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) / 0x50 <=
                     imageId)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    iVar28 = 0xf5;
                    goto LAB_00274181;
                  }
                  ::std::__cxx11::string::string
                            ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                  sVar18 = subset_face_ids._M_h._M_bucket_count;
                  if (subset_face_ids._M_h._M_bucket_count != 0) {
                    pcVar30 = "map_Ks ";
                    goto LAB_002723e8;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar10 = ::std::operator<<(poVar10,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                             );
                  poVar10 = ::std::operator<<(poVar10,":");
                  poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                  poVar10 = ::std::operator<<(poVar10,"():");
                  iVar28 = 0xfa;
LAB_00272587:
                  poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar28);
                  ::std::operator<<(poVar10," ");
                  ::std::__cxx11::string::string
                            ((string *)&face_ids,"Filename for image id {} is empty.",&local_459);
                  fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                  ::std::operator<<(poVar10,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  uVar27 = local_448._M_allocated_capacity;
                  if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                    ::std::__cxx11::string::append((string *)uVar27);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  uVar27 = local_448._8_8_ & 0xffffffff;
                  uVar24 = _local_438;
LAB_0027265d:
                  ::std::__cxx11::string::_M_dispose();
                  if (sVar18 != 0) goto LAB_00272673;
                  goto LAB_002746e2;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                poVar10 = ::std::operator<<(poVar10,"():");
                iVar28 = 0xf0;
LAB_002745f3:
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar28);
                ::std::operator<<(poVar10," ");
                ::std::__cxx11::string::string
                          ((string *)&face_ids_2,"Invalid texture id {}. scene.textures.size = {}",
                           (allocator *)&imageId);
                face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(((long)(scene->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x158);
                fmt::format<int,unsigned_long>
                          ((string *)&subset_face_ids,(fmt *)&face_ids_2,(string *)&texId,
                           (int *)&face_ids,args_1);
              }
              else {
                iVar28 = *(int *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_right +
                                 (long)pRVar6);
                if ((long)iVar28 < 0) {
                  local_450 = *(float *)((long)&((_Rb_tree_node_base *)(uVar24 + 0x80))->_M_left +
                                        (long)((long)&(pRVar6->name)._M_dataplus._M_p + 4U));
                  pcVar30 = "Pm ";
                  goto LAB_00272498;
                }
                pUVar7 = (scene->textures).
                         super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                texId = iVar28;
                if ((int)(((long)(scene->textures).
                                 super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) / 0x158)
                    <= iVar28) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar10 = ::std::operator<<(poVar10,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                             );
                  poVar10 = ::std::operator<<(poVar10,":");
                  poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                  poVar10 = ::std::operator<<(poVar10,"():");
                  iVar28 = 0x106;
                  goto LAB_002745f3;
                }
                imageId = pUVar7[iVar28].texture_image_id;
                if ((-1 < imageId) &&
                   (pTVar8 = (scene->images).
                             super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   imageId < ((long)(scene->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) /
                             0x50)) {
                  ::std::__cxx11::string::string
                            ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                  sVar18 = subset_face_ids._M_h._M_bucket_count;
                  if (subset_face_ids._M_h._M_bucket_count == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    iVar28 = 0x110;
                    goto LAB_00272587;
                  }
                  pcVar30 = "map_Pm ";
LAB_002723e8:
                  sVar18 = subset_face_ids._M_h._M_bucket_count;
                  poVar10 = ::std::operator<<(poVar10,pcVar30);
                  poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                  ::std::operator<<(poVar10,"\n");
                  goto LAB_0027265d;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                poVar10 = ::std::operator<<(poVar10,"():");
                iVar28 = 0x10b;
LAB_00274181:
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar28);
                ::std::operator<<(poVar10," ");
                ::std::__cxx11::string::string
                          ((string *)&face_ids_2,"Invalid image id {}. scene.images.size = {}",
                           &local_459);
                face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(((long)(scene->images).
                                      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scene->images).
                                     super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x50);
                fmt::format<long,unsigned_long>
                          ((string *)&subset_face_ids,(fmt *)&face_ids_2,(string *)&imageId,
                           (long *)&face_ids,args_1);
              }
              poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&subset_face_ids);
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              uVar24 = local_448._M_allocated_capacity;
              if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&subset_face_ids,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&face_ids_2,"\n");
                ::std::__cxx11::string::append((string *)uVar24);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
            else {
              pUVar7 = (scene->textures).
                       super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              texId = iVar28;
              if (iVar28 < (int)(((long)(scene->textures).
                                        super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) /
                                0x158)) {
                imageId = pUVar7[iVar28].texture_image_id;
                if ((-1 < imageId) &&
                   (pTVar8 = (scene->images).
                             super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                   imageId < ((long)(scene->images).
                                    super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar8) /
                             0x50)) {
                  ::std::__cxx11::string::string
                            ((string *)&subset_face_ids,(string *)(pTVar8 + imageId));
                  sVar18 = subset_face_ids._M_h._M_bucket_count;
                  if (subset_face_ids._M_h._M_bucket_count == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xe4);
                    ::std::operator<<(poVar10," ");
                    ::std::__cxx11::string::string
                              ((string *)&face_ids,"Filename for image id {} is empty.",&local_459);
                    fmt::format<long>((string *)&face_ids_2,(string *)&face_ids,&imageId);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_ids_2);
                    ::std::operator<<(poVar10,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    uVar27 = local_448._M_allocated_capacity;
                    uVar2 = local_448._8_4_;
                    if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((string *)&face_ids_2,(string *)&face_ids,"\n");
                      ::std::__cxx11::string::append((string *)uVar27);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  }
                  else {
                    poVar10 = ::std::operator<<(local_1a8,"map_Kd ");
                    poVar10 = ::std::operator<<(poVar10,(string *)&subset_face_ids);
                    ::std::operator<<(poVar10,"\n");
                    uVar2 = local_448._8_4_;
                  }
                  uVar27 = ZEXT48((uint)uVar2);
                  ::std::__cxx11::string::_M_dispose();
                  uVar24 = _local_438;
                  if (sVar18 != 0) goto LAB_0027228a;
                  goto LAB_002746e2;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xdf);
                ::std::operator<<(poVar10," ");
                ::std::__cxx11::string::string
                          ((string *)&face_ids_2,"Invalid image id {}. scene.images.size = {}",
                           &local_459);
                face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(((long)(scene->images).
                                      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scene->images).
                                     super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x50);
                fmt::format<long,unsigned_long>
                          ((string *)&subset_face_ids,(fmt *)&face_ids_2,(string *)&imageId,
                           (long *)&face_ids,args_1);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"export_to_obj");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xda);
                ::std::operator<<(poVar10," ");
                ::std::__cxx11::string::string
                          ((string *)&face_ids_2,"Invalid texture id {}. scene.textures.size = {}",
                           (allocator *)&imageId);
                face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(((long)(scene->textures).
                                      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(scene->textures).
                                     super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x158);
                fmt::format<int,unsigned_long>
                          ((string *)&subset_face_ids,(fmt *)&face_ids_2,(string *)&texId,
                           (int *)&face_ids,args_1);
              }
              poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&subset_face_ids);
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              uVar27 = local_448._M_allocated_capacity;
              if ((string *)local_448._M_allocated_capacity != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&subset_face_ids,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&face_ids_2,"\n");
                ::std::__cxx11::string::append((string *)uVar27);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              uVar27 = local_448._8_8_ & 0xffffffff;
            }
            goto LAB_002746e2;
          }
LAB_002739c3:
          _Var20._M_nxt = (_Var20._M_nxt)->_M_nxt;
        }
        poVar10 = ::std::operator<<(local_1a8,"# ");
        poVar10 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        ::std::operator<<(poVar10," materials.\n");
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)local_200,(string *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
LAB_002746e2:
        uVar25 = (undefined1)uVar27;
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_002746ef:
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&face_groups._M_h);
        goto LAB_00273acd;
      }
      _ss_e = 0;
      this_00 = ::std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)this,(key_type *)&ss_e);
      err = (string *)local_448._M_allocated_capacity;
      uVar9 = this_00->variability - Vertex;
      if (uVar9 < 2) {
        if (this_00->format == Vec2) {
          puVar4 = (this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          for (uVar26 = 0; sVar12 = VertexAttribute::vertex_count(this_00), uVar26 < sVar12;
              uVar26 = uVar26 + 1) {
            poVar10 = ::std::operator<<(local_1a8,"vt ");
            poVar10 = (ostream *)::std::ostream::operator<<(poVar10,*(float *)(puVar4 + uVar26 * 8))
            ;
            poVar10 = ::std::operator<<(poVar10," ");
            poVar10 = (ostream *)
                      ::std::ostream::operator<<(poVar10,*(float *)(puVar4 + uVar26 * 8 + 4));
            ::std::operator<<(poVar10,"\n");
          }
          _local_430 = 0.0;
          uVar27 = local_448._8_8_;
        }
        else {
          _local_430 = (undefined4)CONCAT71((uint7)(uint3)(uVar9 >> 8),1);
        }
        goto LAB_00271704;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar10 = ::std::operator<<(poVar10,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                 );
      poVar10 = ::std::operator<<(poVar10,":");
      poVar10 = ::std::operator<<(poVar10,"export_to_obj");
      poVar10 = ::std::operator<<(poVar10,"():");
      iVar28 = 0x52;
LAB_00273a39:
      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,iVar28);
      ::std::operator<<(poVar10," ");
      pcVar30 = "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0";
      goto LAB_00273a58;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar10 = ::std::operator<<(poVar10,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                               );
    poVar10 = ::std::operator<<(poVar10,":");
    poVar10 = ::std::operator<<(poVar10,"export_to_obj");
    poVar10 = ::std::operator<<(poVar10,"():");
    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0x28);
    ::std::operator<<(poVar10," ");
    ::std::__cxx11::string::string
              ((string *)&subset_face_ids,"mesh_id {} is out-of-range. scene.meshes.size {}",
               (allocator *)&face_ids);
    face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(((long)(scene->meshes).
                          super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(scene->meshes).
                         super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x520);
    fmt::format<int,unsigned_long>
              ((string *)&face_groups,(fmt *)&subset_face_ids,(string *)&mesh_id_local,
               (int *)&face_ids_2,(unsigned_long *)warn);
    poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&face_groups);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &face_groups,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &subset_face_ids,"\n");
    ::std::__cxx11::string::append((string *)err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  uVar25 = 0;
LAB_00273acd:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return (bool)uVar25;
}

Assistant:

bool export_to_obj(const RenderScene &scene, const int mesh_id,
  std::string &obj_str, std::string &mtl_str, std::string *warn, std::string *err) {

  //
  // NOTE:
  //
  // - Export GeomSubset(per-face material) as group(g) + usemtl
  // - Export skin weight as tinyobjloader's 'vw' extension
  //

  (void)obj_str;
  (void)mtl_str;
  (void)warn;

  std::stringstream ss;

  if (mesh_id < 0) {
    PUSH_ERROR_AND_RETURN("Invalid mesh_id");
  } else if (size_t(mesh_id) >= scene.meshes.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("mesh_id {} is out-of-range. scene.meshes.size {}", mesh_id, scene.meshes.size()));
  }

  const RenderMesh &mesh = scene.meshes[size_t(mesh_id)];

  ss << "# exported from TinyUSDZ Tydra.\n";
  ss << "mtllib " << mesh_id << mesh.prim_name + ".mtl";
  ss << "\n";
  
  for (size_t i = 0; i < mesh.points.size(); i++) {
    ss << "v " << mesh.points[i][0] << " " << mesh.points[i][1] << " " << mesh.points[i][2] << "\n";
  } 
  ss << "# " << mesh.points.size() << " vertices\n";

  if (mesh.joint_and_weights.jointWeights.size() == (mesh.points.size() * size_t(mesh.joint_and_weights.elementSize))) {
     
    size_t elementSize = size_t(mesh.joint_and_weights.elementSize); // # of weights per vertex.
    for (size_t i = 0; i < mesh.points.size(); i++) {
      ss << "vw ";
      for (size_t w = 0; w < elementSize; w++) {
        if (w > 0) {
          ss << " ";
        }
        ss << mesh.joint_and_weights.jointIndices[i * elementSize + w] << " " << mesh.joint_and_weights.jointWeights[i * elementSize + w];
      } 
      ss << "\n";
    }
  }

  bool has_texcoord = false;
  bool is_facevarying_texcoord = false;
  bool has_normal = false;
  bool is_facevarying_normal = false;

  // primary texcoord only
  if (mesh.texcoords.count(0)) {
    const VertexAttribute &texcoord = mesh.texcoords.at(0);  
    if (texcoord.variability == VertexVariability::FaceVarying) {
      is_facevarying_texcoord = true;
    } else if (texcoord.variability == VertexVariability::Vertex) {
      is_facevarying_texcoord = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (texcoord.format == VertexAttributeFormat::Vec2) {
      const float *ptr = reinterpret_cast<const float *>(texcoord.buffer());
      for (size_t i = 0; i < texcoord.vertex_count(); i++) {
        ss << "vt " << ptr[2 * i + 0] << " " << ptr[2 * i + 1] << "\n";
      } 

      has_texcoord = true;
    }
  }

  if (!mesh.normals.empty()) {
    if (mesh.normals.variability == VertexVariability::FaceVarying) {
      is_facevarying_normal = true;
    } else if (mesh.normals.variability == VertexVariability::Vertex) {
      is_facevarying_normal = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (mesh.normals.format == VertexAttributeFormat::Vec3) {
      const float *ptr = reinterpret_cast<const float *>(mesh.normals.buffer());
      for (size_t i = 0; i < mesh.normals.vertex_count(); i++) {
        ss << "vn " << ptr[3 * i + 0] << " " << ptr[3 * i + 1] << " " << ptr[3 * i + 2] << "\n";
      } 
      has_normal = true;
    }
  }

  // name -> (mat_id, face_ids)
  std::unordered_map<std::string, std::pair<int, std::vector<uint32_t>>> face_groups;
  if (mesh.material_subsetMap.size()) {

    std::unordered_set<uint32_t> subset_face_ids;

    for (const auto &subset : mesh.material_subsetMap) {
      std::vector<uint32_t> face_ids(subset.second.indices().size());
      for (size_t i = 0; i < subset.second.indices().size(); i++) {
        face_ids[i] = uint32_t(subset.second.indices()[i]); 
        subset_face_ids.insert(face_ids[i]);
      }
      if (subset.first.empty()) {
        PUSH_ERROR_AND_RETURN("Empty material_subset name is not allowed.");
      }
      face_groups[subset.first] = std::make_pair(subset.second.material_id, face_ids);
    }

    // face_ids without materialsubset
    std::vector<uint32_t> face_ids;
    for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
      if (!subset_face_ids.count(uint32_t(i))) {
        face_ids.push_back(uint32_t(i));
      }
    }
    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  } else {
    std::vector<uint32_t> face_ids(mesh.faceVertexCounts().size());
    std::iota(face_ids.begin(), face_ids.end(), 0);

    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  }

  // build face_id -> location in mesh.faceVertexIndices table.
  std::vector<size_t> offsets(mesh.faceVertexCounts().size());
  size_t offset = 0;
  for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
    offsets[i] = offset;
    offset += mesh.faceVertexCounts()[i];
  }

  size_t faceIndexOffset = 0;
  // Assume empty group name is iterated first.
  for (const auto &group : face_groups) {

    if (group.first.size()) {
      ss << "g " << group.first << "\n";
    }

    if (std::get<0>(group.second) > -1) {
      uint32_t mat_id = uint32_t(std::get<0>(group.second));
      ss << "usemtl " << scene.materials[mat_id].name << "\n";
    } 

    const auto &face_ids = std::get<1>(group.second);

    for (size_t i = 0; i < face_ids.size(); i++) {
      ss << "f ";

      for (size_t f = 0; f < mesh.faceVertexCounts()[face_ids[i]]; f++) {
        if (f > 0) {
          ss << " ";
        }
        // obj's index starts with 1.
        uint32_t idx = mesh.faceVertexIndices()[offsets[face_ids[i]] + f] + 1;

        uint32_t t_idx = is_facevarying_texcoord ? uint32_t(faceIndexOffset + f) : idx;
        uint32_t n_idx = is_facevarying_normal ? uint32_t(faceIndexOffset + f) : idx;

        if (has_texcoord && has_normal) {
          ss << idx << "/" << t_idx << "/" << n_idx;
        } else if (has_texcoord) {
          ss << idx << "/" << t_idx;
        } else if (has_normal) {
          ss << idx << "//" << n_idx;
        } else {
          ss << idx;
        }
      }

      faceIndexOffset += mesh.faceVertexIndices()[face_ids[i]];
      ss << "\n";
    }

    ss << "\n";
  }

  obj_str = ss.str();

  ss.str("");
  ss << "# exported from TinyUSDZ Tydra.\n";

  // emit material info
  for (const auto &group : face_groups) {
    if (group.second.first == -1) {
      continue;
    }

    uint32_t mat_id = uint32_t(std::get<0>(group.second));
    ss << "newmtl " << scene.materials[mat_id].name << "\n";

    // Original MTL spec: https://paulbourke.net/dataformats/mtl/
    // Emit PBR material: https://github.com/tinyobjloader/tinyobjloader/blob/release/pbr-mtl.md
    
    if (scene.materials[mat_id].surfaceShader.diffuseColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.diffuseColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Kd " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.diffuseColor.value;
      ss << "Kd " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.useSpecularWorkflow) {
      if (scene.materials[mat_id].surfaceShader.specularColor.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.specularColor.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Ks " << texname << "\n";
      } else {
        const auto col = scene.materials[mat_id].surfaceShader.specularColor.value;
        ss << "Ks " << col[0] << " " << col[1] << " " << col[2] << "\n";
      }
    } else {

      if (scene.materials[mat_id].surfaceShader.metallic.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.metallic.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Pm " << texname << "\n";
      } else {
        const auto f = scene.materials[mat_id].surfaceShader.metallic.value;
        ss << "Pm " << f << "\n";
      }
    }

    if (scene.materials[mat_id].surfaceShader.roughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.roughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.roughness.value;
      ss << "Pr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.emissiveColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.emissiveColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Ke " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.emissiveColor.value;
      ss << "Ke " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }


    if (scene.materials[mat_id].surfaceShader.opacity.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.opacity.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_d " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.opacity.value;
      ss << "d " << f << "\n";
    }

    // emit as cleacoat thickness
    if (scene.materials[mat_id].surfaceShader.clearcoat.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoat.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pc " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoat.value;
      ss << "Pc " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.clearcoatRoughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoatRoughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pcr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Pcr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.occlusion.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.occlusion.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // Use map_ao?
      ss << "map_Ka " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.occlusion.value;
      ss << "Ka " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    // TODO: opacityThreshold

    ss << "\n";
  }
  ss << "# " << face_groups.size() << " materials.\n";

  mtl_str = ss.str();

  return true;
}